

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall
Dashel::SocketServerStream::SocketServerStream(SocketServerStream *this,string *targetName)

{
  _func_int *p_Var1;
  int iVar2;
  string *name;
  DashelException *pDVar3;
  int *piVar4;
  IPV4Address bindAddress;
  socklen_t sizeof_addr;
  int flag;
  char *local_1c8 [4];
  sockaddr_in addr;
  ostringstream portnum;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&portnum,"tcpin",(allocator<char> *)local_1c8);
  Stream::Stream((Stream *)&(this->super_SelectableStream).field_0x10,(string *)&portnum);
  std::__cxx11::string::~string((string *)&portnum);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&portnum,"tcpin",(allocator<char> *)local_1c8);
  (this->super_SelectableStream)._vptr_SelectableStream = (_func_int **)0x1263a0;
  *(undefined8 *)&(this->super_SelectableStream).field_0x10 = 0x1263f0;
  (this->super_SelectableStream).fd = -1;
  (this->super_SelectableStream).writeOnly = false;
  (this->super_SelectableStream).pollEvent = 1;
  std::__cxx11::string::~string((string *)&portnum);
  (this->super_SelectableStream)._vptr_SelectableStream =
       (_func_int **)&PTR__SocketServerStream_001262d8;
  *(undefined ***)&(this->super_SelectableStream).field_0x10 = &PTR__SocketServerStream_00126340;
  ParameterSet::add((ParameterSet *)&(this->super_SelectableStream).field_0x40,
                    "tcpin:port=5000;address=0.0.0.0");
  ParameterSet::add((ParameterSet *)
                    (&(this->super_SelectableStream).field_0x30 +
                    (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),
                    (targetName->_M_dataplus)._M_p);
  name = ParameterSet::get_abi_cxx11_
                   ((ParameterSet *)
                    (&(this->super_SelectableStream).field_0x30 +
                    (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"address");
  iVar2 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_SelectableStream).field_0x30 +
                     (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"port");
  IPV4Address::IPV4Address(&bindAddress,name,(unsigned_short)iVar2);
  iVar2 = socket(2,1,6);
  (this->super_SelectableStream).fd = iVar2;
  if (iVar2 < 0) {
    pDVar3 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    DashelException::DashelException
              (pDVar3,ConnectionFailed,*piVar4,"Cannot create socket.",(Stream *)0x0);
    __cxa_throw(pDVar3,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  flag = 1;
  iVar2 = setsockopt(iVar2,1,2,&flag,4);
  if (iVar2 < 0) {
    pDVar3 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    DashelException::DashelException
              (pDVar3,ConnectionFailed,*piVar4,
               "Cannot set address reuse flag on socket, probably the port is already in use.",
               (Stream *)0x0);
    __cxa_throw(pDVar3,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  addr.sin_family = 2;
  addr.sin_port = bindAddress.port << 8 | bindAddress.port >> 8;
  addr.sin_addr.s_addr =
       bindAddress.address >> 0x18 | (bindAddress.address & 0xff0000) >> 8 |
       (bindAddress.address & 0xff00) << 8 | bindAddress.address << 0x18;
  iVar2 = bind((this->super_SelectableStream).fd,(sockaddr *)&addr,0x10);
  if (iVar2 == 0) {
    if (bindAddress.port == 0) {
      sizeof_addr = 0x10;
      iVar2 = getsockname((this->super_SelectableStream).fd,(sockaddr *)&addr,&sizeof_addr);
      if (iVar2 != 0) {
        pDVar3 = (DashelException *)__cxa_allocate_exception(0x20);
        piVar4 = __errno_location();
        DashelException::DashelException
                  (pDVar3,ConnectionFailed,*piVar4,"Cannot retrieve socket port assignment.",
                   (Stream *)0x0);
        __cxa_throw(pDVar3,&DashelException::typeinfo,std::runtime_error::~runtime_error);
      }
      ParameterSet::erase((ParameterSet *)
                          (&(this->super_SelectableStream).field_0x30 +
                          (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"port");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&portnum);
      std::ostream::operator<<((ostream *)&portnum,addr.sin_port << 8 | addr.sin_port >> 8);
      p_Var1 = (this->super_SelectableStream)._vptr_SelectableStream[-3];
      std::__cxx11::stringbuf::str();
      ParameterSet::addParam
                ((ParameterSet *)(&(this->super_SelectableStream).field_0x30 + (long)p_Var1),"port",
                 local_1c8[0],true);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&portnum);
    }
    iVar2 = listen((this->super_SelectableStream).fd,0x10);
    if (-1 < iVar2) {
      return;
    }
    pDVar3 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    DashelException::DashelException
              (pDVar3,ConnectionFailed,*piVar4,"Cannot listen on socket.",(Stream *)0x0);
  }
  else {
    pDVar3 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    DashelException::DashelException
              (pDVar3,ConnectionFailed,*piVar4,
               "Cannot bind socket to port, probably the port is already in use.",(Stream *)0x0);
  }
  __cxa_throw(pDVar3,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit SocketServerStream(const std::string& targetName) :
			Stream("tcpin"),
			SelectableStream("tcpin")
		{
			target.add("tcpin:port=5000;address=0.0.0.0");
			target.add(targetName.c_str());

			IPV4Address bindAddress(target.get("address"), target.get<int>("port"));

			// create socket
			fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (fd < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot create socket.");

			// reuse address
			int flag = 1;
			if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &flag, sizeof(flag)) < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot set address reuse flag on socket, probably the port is already in use.");

			// bind
			sockaddr_in addr;
			addr.sin_family = AF_INET;
			addr.sin_port = htons(bindAddress.port);
			addr.sin_addr.s_addr = htonl(bindAddress.address);
			if (::bind(fd, (struct sockaddr*)&addr, sizeof(addr)) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot bind socket to port, probably the port is already in use.");

			// retrieve port number, if a dynamic one was requested
			if (bindAddress.port == 0)
			{
				socklen_t sizeof_addr(sizeof(addr));
				if (::getsockname(fd, (struct sockaddr*)&addr, &sizeof_addr) != 0)
					throw DashelException(DashelException::ConnectionFailed, errno, "Cannot retrieve socket port assignment.");
				target.erase("port");
				ostringstream portnum;
				portnum << ntohs(addr.sin_port);
				target.addParam("port", portnum.str().c_str(), true);
			}

			// Listen on socket, backlog is sort of arbitrary.
			if (listen(fd, 16) < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot listen on socket.");
		}